

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse.c
# Opt level: O0

void verify_archive_file(char *name,archive_contents *ac)

{
  char cVar1;
  undefined8 *puVar2;
  archive_conflict *v1;
  int iVar3;
  wchar_t wVar4;
  archive_conflict *a_00;
  char *v2;
  undefined8 *puStack_70;
  char c;
  contents *cts;
  archive *a;
  void *p;
  contents actual;
  contents expect;
  archive_entry *paStack_20;
  int err;
  archive_entry *ae;
  archive_contents *ac_local;
  char *name_local;
  
  ae = (archive_entry *)ac;
  ac_local = (archive_contents *)name;
  extract_reference_file(name);
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'º',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar3 = archive_read_support_filter_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'»',(uint)(iVar3 == 0),"0 == archive_read_support_filter_all(a)",(void *)0x0);
  wVar4 = archive_read_support_format_tar((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'¼',(uint)(wVar4 == L'\0'),"0 == archive_read_support_format_tar(a)",
                   (void *)0x0);
  failure("Can\'t open %s",ac_local);
  wVar4 = archive_read_open_filename(a_00,(char *)ac_local,3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                   ,L'¾',(uint)(wVar4 == L'\0'),"0 == archive_read_open_filename(a, name, 3)",
                   (void *)0x0);
  while( true ) {
    if (ae->archive == (archive_conflict *)0x0) {
      iVar3 = archive_read_next_header((archive *)a_00,&stack0xffffffffffffffe0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'Ā',1,"ARCHIVE_EOF",(long)iVar3,"err",a_00);
      iVar3 = archive_read_close((archive *)a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'Ă',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",a_00);
      iVar3 = archive_read_free((archive *)a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                          ,L'ă',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
      return;
    }
    puVar2 = (undefined8 *)ae->stat;
    iVar3 = archive_read_next_header((archive *)a_00,&stack0xffffffffffffffe0);
    wVar4 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                                ,L'Ã',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",a_00);
    if (wVar4 == L'\0') break;
    failure("Name mismatch in archive %s",ac_local);
    v1 = ae->archive;
    v2 = archive_entry_pathname(paStack_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
               ,L'È',(char *)v1,"ac->filename",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    wVar4 = archive_entry_is_encrypted(paStack_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'É',(long)wVar4,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar3 = archive_read_has_encrypted_entries((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'Ê',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
    puStack_70 = puVar2 + 3;
    actual.d = (char *)*puVar2;
    expect.o = puVar2[1];
    expect.s = puVar2[2];
    while (iVar3 = archive_read_data_block((archive *)a_00,&a,(size_t *)&actual,(la_int64_t *)&p),
          iVar3 == 0) {
      actual.s = (size_t)a;
      for (; actual.o != 0; actual.o = actual.o + -1) {
        cVar1 = *(char *)actual.s;
        if ((long)p < (long)actual.d) {
          failure("%s: pad at offset %jd should be zero",ac_local,p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                              ,L'Ú',(long)cVar1,"c",0,"0",(void *)0x0);
        }
        else {
          if ((char *)p != actual.d) {
            failure("%s: Unexpected trailing data",ac_local);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                             ,L'ì',(uint)((long)p <= (long)actual.d),"actual.o <= expect.o",
                             (void *)0x0);
            archive_read_free((archive *)a_00);
            return;
          }
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                              ,L'ß',(long)cVar1,"c",(long)*(char *)expect.s,"*expect.d",(void *)0x0
                             );
          expect.s = expect.s + 1;
          actual.d = actual.d + 1;
          expect.o = expect.o + -1;
          if (expect.o == 0) {
            actual.d = (char *)*puStack_70;
            expect.o = puStack_70[1];
            expect.s = puStack_70[2];
            puStack_70 = puStack_70 + 3;
          }
        }
        actual.s = actual.s + 1;
        p = (void *)((long)p + 1);
      }
    }
    failure("%s: should be end of entry",ac_local);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'ö',(long)iVar3,"err",1,"ARCHIVE_EOF",a_00);
    failure("%s: Size returned at EOF must be zero",ac_local);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'ø',(long)(int)actual.o,"(int)actual.s",0,"0",(void *)0x0);
    failure("%s: Offset of final empty chunk must be same as file size",ac_local);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                        ,L'ú',(longlong)p,"actual.o",(longlong)actual.d,"expect.o",(void *)0x0);
    ae = (archive_entry *)&ae->stat_valid;
  }
  iVar3 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_gtar_sparse.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
verify_archive_file(const char *name, struct archive_contents *ac)
{
	struct archive_entry *ae;
	int err;
	/* data, size, offset of next expected block. */
	struct contents expect;
	/* data, size, offset of block read from archive. */
	struct contents actual;
	const void *p;
	struct archive *a;

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assert(0 == archive_read_support_filter_all(a));
	assert(0 == archive_read_support_format_tar(a));
	failure("Can't open %s", name);
	assert(0 == archive_read_open_filename(a, name, 3));

	while (ac->filename != NULL) {
		struct contents *cts = ac->contents;

		if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae))) {
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			return;
		}
		failure("Name mismatch in archive %s", name);
		assertEqualString(ac->filename, archive_entry_pathname(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		expect = *cts++;
		while (0 == (err = archive_read_data_block(a,
				 &p, &actual.s, &actual.o))) {
			actual.d = p;
			while (actual.s > 0) {
				char c = *actual.d;
				if(actual.o < expect.o) {
					/*
					 * Any byte before the expected
					 * data must be NULL.
					 */
					failure("%s: pad at offset %jd "
						"should be zero", name,
						(intmax_t)actual.o);
					assertEqualInt(c, 0);
				} else if (actual.o == expect.o) {
					/*
					 * Data at matching offsets must match.
					 */
					assertEqualInt(c, *expect.d);
					expect.d++;
					expect.o++;
					expect.s--;
					/* End of expected? step to next expected. */
					if (expect.s <= 0)
						expect = *cts++;
				} else {
					/*
					 * We found data beyond that expected.
					 */
					failure("%s: Unexpected trailing data",
					    name);
					assert(actual.o <= expect.o);
					archive_read_free(a);
					return;
				}
				actual.d++;
				actual.o++;
				actual.s--;
			}
		}
		failure("%s: should be end of entry", name);
		assertEqualIntA(a, err, ARCHIVE_EOF);
		failure("%s: Size returned at EOF must be zero", name);
		assertEqualInt((int)actual.s, 0);
		failure("%s: Offset of final empty chunk must be same as file size", name);
		assertEqualInt(actual.o, expect.o);
		/* Step to next file description. */
		++ac;
	}

	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_EOF, err);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}